

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

string_view pbrt::dequoteString(Token *t)

{
  ulong uVar1;
  char *pcVar2;
  string_view sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = (t->token)._M_len;
  pcVar2 = (t->token)._M_str;
  if (((1 < uVar1) && (*pcVar2 == '\"')) && (pcVar2[uVar1 - 1] == '\"')) {
    sVar3._M_str = pcVar2 + 1;
    sVar3._M_len = uVar1 - 2;
    return sVar3;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar2 + uVar1);
  ErrorExit<std::__cxx11::string>(&t->loc,"\"%s\": expected quoted string",&local_38);
}

Assistant:

static std::string_view dequoteString(const Token &t) {
    if (!isQuotedString(t.token))
        ErrorExit(&t.loc, "\"%s\": expected quoted string", toString(t.token));

    std::string_view str = t.token;
    str.remove_prefix(1);
    str.remove_suffix(1);
    return str;
}